

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O3

bool __thiscall CheckStructure::isMain(CheckStructure *this,string *nameMain)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pbVar2;
  _Alloc_hider _Var3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  __n = nameMain->_M_string_length;
  if (__n == (this->nMain)._M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar4 = bcmp((nameMain->_M_dataplus)._M_p,(this->nMain)._M_dataplus._M_p,__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)nameMain);
  pbVar2 = (this->delimiters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_70._M_string_length == pbVar2[5]._M_string_length) &&
     ((local_70._M_string_length == 0 ||
      (iVar4 = bcmp(local_70._M_dataplus._M_p,pbVar2[5]._M_dataplus._M_p,local_70._M_string_length),
      iVar4 == 0)))) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)nameMain);
    if (local_48 == (this->nMain)._M_string_length) {
      if (local_48 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_50,(this->nMain)._M_dataplus._M_p,local_48);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    bVar6 = false;
  }
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (bVar6) {
    this->m_countCalls = this->m_countCalls + 2;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)nameMain);
    _Var3._M_p = local_70._M_dataplus._M_p;
    pbVar2 = (this->delimiters).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_70._M_string_length == pbVar2[2]._M_string_length) {
      if (local_70._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar4 = bcmp(local_70._M_dataplus._M_p,pbVar2[2]._M_dataplus._M_p,local_70._M_string_length)
        ;
        bVar5 = iVar4 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p);
    }
    bVar6 = true;
    if (bVar5) {
      this->m_countCalls = this->m_countCalls + 1;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)nameMain);
      if (local_70._M_string_length == (this->nReturn)._M_string_length) {
        if (local_70._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          iVar4 = bcmp(local_70._M_dataplus._M_p,(this->nReturn)._M_dataplus._M_p,
                       local_70._M_string_length);
          bVar5 = iVar4 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar5) {
        this->m_countCalls = this->m_countCalls + 1;
      }
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)nameMain);
    pbVar2 = (this->delimiters).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_70._M_string_length == pbVar2->_M_string_length) {
      if (local_70._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_70._M_dataplus._M_p,(pbVar2->_M_dataplus)._M_p,local_70._M_string_length)
        ;
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar6) {
      this->m_countCalls = this->m_countCalls + 1;
      bVar6 = true;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"wrong name of main func","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_errors,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool CheckStructure::isMain(string nameMain) {
    if (nameMain == nMain)
        return true;
    if ((nameMain.substr(4, 2) == delimiters[5]) && (nameMain.substr(0, 4) == nMain)) {
        m_countCalls += 2;
        if (nameMain.substr(6, 1) == delimiters[2]) {
            m_countCalls++;
            if (nameMain.substr(7, 6) == nReturn)
                m_countCalls++;
        }
        return true;
    }
    if (nameMain.substr(4, 1) == delimiters[0]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong name of main func");
    return false;
}